

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

void __thiscall
PlanningUnitMADPDiscrete::JointToIndividualPolicyDomainIndicesRef(PlanningUnitMADPDiscrete *this)

{
  PolicyDomainCategory in_EDX;
  Index in_ESI;
  
  JointToIndividualPolicyDomainIndicesRef
            ((PlanningUnitMADPDiscrete *)
             &this[-1]._m_jaohConditionalProbs.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish,in_ESI,in_EDX);
  return;
}

Assistant:

const vector<Index>& PlanningUnitMADPDiscrete::JointToIndividualPolicyDomainIndicesRef( 
    Index jdI, PolicyGlobals::PolicyDomainCategory cat) const
{
    switch ( cat )
    {
    case PolicyGlobals::OHIST_INDEX :
        return JointToIndividualObservationHistoryIndicesRef(jdI);
        break;
    case PolicyGlobals::AOHIST_INDEX :
        return JointToIndividualActionObservationHistoryIndicesRef(jdI);
        break;
    case PolicyGlobals::TYPE_INDEX : 
        throw(E("JointToIndividualPolicyDomainIndicesRef: types are not a valid policy domain for a PlanningUnitMADPDiscrete"));
        break;
    default:
        throw(E("JointToIndividualPolicyDomainIndicesRef: incorrect JointPolicyDiscrete::PolicyGlobals::PolicyDomainCategory"));
        break;
    }
}